

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O1

void __thiscall
icu_63::MessagePattern::setParseError(MessagePattern *this,UParseError *parseError,int32_t index)

{
  short sVar1;
  char16_t *pcVar2;
  uint uVar3;
  uint uVar4;
  
  if (parseError != (UParseError *)0x0) {
    parseError->offset = index;
    uVar3 = index;
    if (0xf < index) {
      sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        uVar4 = (this->msg).fUnion.fFields.fLength;
      }
      else {
        uVar4 = (int)sVar1 >> 5;
      }
      uVar3 = 0xf;
      if (index - 0xfU < uVar4) {
        if (((int)sVar1 & 2U) == 0) {
          pcVar2 = (this->msg).fUnion.fFields.fArray;
        }
        else {
          pcVar2 = (char16_t *)((long)&(this->msg).fUnion + 2);
        }
        uVar3 = (pcVar2[(int)(index - 0xfU)] & 0xfc00U) == 0xdc00 ^ 0xf;
      }
    }
    icu_63::UnicodeString::doExtract(&this->msg,index - uVar3,uVar3,parseError->preContext,0);
    parseError->preContext[(int)uVar3] = L'\0';
    sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      uVar3 = (this->msg).fUnion.fFields.fLength;
    }
    else {
      uVar3 = (int)sVar1 >> 5;
    }
    uVar4 = uVar3 - index;
    if (0xf < (int)uVar4) {
      uVar4 = 0xf;
      if (index + 0xeU < uVar3) {
        if (((int)sVar1 & 2U) == 0) {
          pcVar2 = (this->msg).fUnion.fFields.fArray;
        }
        else {
          pcVar2 = (char16_t *)((long)&(this->msg).fUnion + 2);
        }
        uVar4 = (pcVar2[(int)(index + 0xeU)] & 0xfc00U) == 0xd800 ^ 0xf;
      }
    }
    icu_63::UnicodeString::doExtract(&this->msg,index,uVar4,parseError->postContext,0);
    parseError->postContext[(int)uVar4] = L'\0';
  }
  return;
}

Assistant:

void
MessagePattern::setParseError(UParseError *parseError, int32_t index) {
    if(parseError==NULL) {
        return;
    }
    parseError->offset=index;

    // Set preContext to some of msg before index.
    // Avoid splitting a surrogate pair.
    int32_t length=index;
    if(length>=U_PARSE_CONTEXT_LEN) {
        length=U_PARSE_CONTEXT_LEN-1;
        if(length>0 && U16_IS_TRAIL(msg[index-length])) {
            --length;
        }
    }
    msg.extract(index-length, length, parseError->preContext);
    parseError->preContext[length]=0;

    // Set postContext to some of msg starting at index.
    length=msg.length()-index;
    if(length>=U_PARSE_CONTEXT_LEN) {
        length=U_PARSE_CONTEXT_LEN-1;
        if(length>0 && U16_IS_LEAD(msg[index+length-1])) {
            --length;
        }
    }
    msg.extract(index, length, parseError->postContext);
    parseError->postContext[length]=0;
}